

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmDoWhile(LlvmCompilationContext *ctx,ExprDoWhile *node)

{
  ExprBase *pEVar1;
  ExprDoWhile *pEVar2;
  int iVar3;
  LLVMValueRef pLVar4;
  TypeBase *type;
  LLVMTypeRef pLVar5;
  LLVMValueRef pLVar6;
  LLVMValueRef condition;
  LLVMBasicBlockRef local_30;
  LLVMBasicBlockRef exitBlock;
  LLVMBasicBlockRef condBlock;
  LLVMBasicBlockRef bodyBlock;
  ExprDoWhile *node_local;
  LlvmCompilationContext *ctx_local;
  
  bodyBlock = (LLVMBasicBlockRef)node;
  node_local = (ExprDoWhile *)ctx;
  condBlock = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"do_body");
  exitBlock = LLVMAppendBasicBlockInContext
                        ((LLVMContextRef)(node_local->super_ExprBase).source,
                         (LLVMValueRef)node_local[0x42].super_ExprBase._vptr_ExprBase,"do_cond");
  local_30 = LLVMAppendBasicBlockInContext
                       ((LLVMContextRef)(node_local->super_ExprBase).source,
                        (LLVMValueRef)node_local[0x42].super_ExprBase._vptr_ExprBase,"do_exit");
  LLVMBuildBr((LLVMBuilderRef)(node_local->super_ExprBase).next,condBlock);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,condBlock);
  pEVar2 = node_local + 0x44;
  LlvmCompilationContext::LoopInfo::LoopInfo((LoopInfo *)&condition,local_30,exitBlock);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::push_back
            ((SmallArray<LlvmCompilationContext::LoopInfo,_32U> *)&pEVar2->body,
             (LoopInfo *)&condition);
  CompileLlvm((LlvmCompilationContext *)node_local,*(ExprBase **)(bodyBlock + 0x30));
  LLVMBuildBr((LLVMBuilderRef)(node_local->super_ExprBase).next,exitBlock);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,exitBlock);
  pLVar4 = CompileLlvm((LlvmCompilationContext *)node_local,*(ExprBase **)(bodyBlock + 0x38));
  pEVar2 = node_local;
  iVar3 = LLVMIntNE;
  pEVar1 = (node_local->super_ExprBase).next;
  type = GetStackType((LlvmCompilationContext *)node_local,
                      *(TypeBase **)(*(long *)(bodyBlock + 0x38) + 0x18));
  pLVar5 = CompileLlvmType((LlvmCompilationContext *)pEVar2,type);
  pLVar6 = LLVMConstInt(pLVar5,0,true);
  pLVar4 = LLVMBuildICmp((LLVMBuilderRef)pEVar1,iVar3,pLVar4,pLVar6,"");
  LLVMBuildCondBr((LLVMBuilderRef)(node_local->super_ExprBase).next,pLVar4,condBlock,local_30);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,local_30);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::pop_back
            ((SmallArray<LlvmCompilationContext::LoopInfo,_32U> *)&node_local[0x44].body);
  pLVar4 = CheckType((LlvmCompilationContext *)node_local,(ExprBase *)bodyBlock,(LLVMValueRef)0x0);
  return pLVar4;
}

Assistant:

LLVMValueRef CompileLlvmDoWhile(LlvmCompilationContext &ctx, ExprDoWhile *node)
{
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_body");
	LLVMBasicBlockRef condBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_cond");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_exit");

	LLVMBuildBr(ctx.builder, bodyBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, condBlock));

	CompileLlvm(ctx, node->body);

	LLVMBuildBr(ctx.builder, condBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, condBlock);

	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}